

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::VertexInput::Implementation::~Implementation
          (Implementation *this)

{
  DeviceInterface *pDVar1;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  VkImageView obj_01;
  VkPipeline obj_02;
  VkPipelineLayout obj_03;
  VkFramebuffer obj_04;
  VkRenderPass obj_05;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_00d31110;
  if ((this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal != 0) {
    pDVar1 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    (*pDVar1->_vptr_DeviceInterface[0x3d])
              (pDVar1,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
  }
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
  m_internal = 0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_01.m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_01);
  }
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            (&(this->m_colorAttachmentImage).
              super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            );
  obj_02.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_02);
  }
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj_03.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_03);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_04.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_04);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  obj_05.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_05.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_05);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_indirectBuffer).
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_indexBuffer).
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            (&(this->m_outputBuffer).
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            );
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource)
		: m_context		(context)
		, m_resource	(resource)
	{
		requireFeaturesForSSBOAccess (m_context, VK_SHADER_STAGE_VERTEX_BIT);

		const DeviceInterface&		vk				= context.getDeviceInterface();
		const VkDevice				device			= context.getDevice();
		Allocator&					allocator		= context.getAllocator();
		const VkDeviceSize			dataSizeBytes	= m_resource.getBuffer().size;

		m_outputBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
			makeBufferCreateInfo(dataSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible));

		{
			const Allocation& alloc = m_outputBuffer->getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(dataSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), dataSizeBytes);
		}

		m_descriptorSetLayout = DescriptorSetLayoutBuilder()
			.addSingleBinding	(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_VERTEX_BIT)
			.build				(vk, device);

		m_descriptorPool = DescriptorPoolBuilder()
			.addType	(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
			.build		(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		const VkDescriptorBufferInfo outputBufferDescriptorInfo = makeDescriptorBufferInfo(m_outputBuffer->get(), 0ull, dataSizeBytes);
		DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &outputBufferDescriptorInfo)
			.update		(vk, device);

		// Color attachment
		m_colorFormat						= VK_FORMAT_R8G8B8A8_UNORM;
		m_colorImageSubresourceRange		= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		m_colorImageExtent					= makeExtent3D(16u, 16u, 1u);
		m_colorAttachmentImage				= de::MovePtr<Image>(new Image(vk, device, allocator,
			makeImageCreateInfo(VK_IMAGE_TYPE_2D, m_colorImageExtent, m_colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT),
			MemoryRequirement::Any));

		// Pipeline
		m_colorAttachmentView	= makeImageView		(vk, device, **m_colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorImageSubresourceRange);
		m_renderPass			= makeRenderPass	(vk, device, m_colorFormat);
		m_framebuffer			= makeFramebuffer	(vk, device, *m_renderPass, *m_colorAttachmentView, m_colorImageExtent.width, m_colorImageExtent.height, 1u);
		m_pipelineLayout		= makePipelineLayout(vk, device, *m_descriptorSetLayout);

		m_pipeline = GraphicsPipelineBuilder()
			.setPrimitiveTopology			(VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
			.setRenderSize					(tcu::IVec2(static_cast<int>(m_colorImageExtent.width), static_cast<int>(m_colorImageExtent.height)))
			.setVertexInputSingleAttribute	(VK_FORMAT_R32G32B32A32_UINT, tcu::getPixelSize(mapVkFormat(VK_FORMAT_R32G32B32A32_UINT)))
			.setShader						(vk, device, VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("input_vert"), DE_NULL)
			.setShader						(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("input_frag"), DE_NULL)
			.build							(vk, device, *m_pipelineLayout, *m_renderPass, context.getPipelineCacheData());
	}